

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestcompareType::runTestCase(TestValueTestcompareType *this)

{
  Value *in_RDI;
  PredicateContext _minitest_Context_6;
  PredicateContext _minitest_Context_5;
  PredicateContext _minitest_Context_4;
  PredicateContext _minitest_Context_3;
  PredicateContext _minitest_Context_2;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  undefined4 in_stack_fffffffffffffc58;
  Int in_stack_fffffffffffffc5c;
  UInt value;
  undefined1 value_00;
  undefined4 in_stack_fffffffffffffc68;
  ValueType in_stack_fffffffffffffc6c;
  ValueTest *in_stack_fffffffffffffc70;
  Value *in_stack_fffffffffffffc90;
  undefined4 local_348 [2];
  char *local_340;
  undefined4 local_338;
  char *local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined4 local_2c8 [2];
  char *local_2c0;
  undefined4 local_2b8;
  char *local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined4 local_248 [2];
  char *local_240;
  undefined4 local_238;
  char *local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined4 local_1c8 [2];
  char *local_1c0;
  undefined4 local_1b8;
  char *local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined4 local_148 [2];
  char *local_140;
  undefined4 local_138;
  char *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined4 local_c8 [2];
  char *local_c0;
  undefined4 local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_38 [2];
  char *local_30;
  undefined4 local_28;
  char *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_38[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_28 = 0x572;
  local_20 = "checkIsLess(Json::Value(), Json::Value(1))";
  local_18 = 0;
  local_10 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_38;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_38;
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  Json::Value::Value(in_RDI,in_stack_fffffffffffffc5c);
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_c8[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_b8 = 0x573;
  local_b0 = "checkIsLess(Json::Value(1), Json::Value(1u))";
  local_a8 = 0;
  local_a0 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_c8;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_c8;
  value = 1;
  Json::Value::Value(in_RDI,1);
  Json::Value::Value(in_RDI,value);
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_148[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_138 = 0x574;
  local_130 = "checkIsLess(Json::Value(1u), Json::Value(1.0))";
  local_128 = 0;
  local_120 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_148;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_148;
  Json::Value::Value(in_RDI,value);
  Json::Value::Value(in_RDI,(double)CONCAT44(value,in_stack_fffffffffffffc58));
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_1c8[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1b8 = 0x575;
  local_1b0 = "checkIsLess(Json::Value(1.0), Json::Value(\"a\"))";
  local_1a8 = 0;
  local_1a0 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_1c8;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_1c8;
  Json::Value::Value(in_RDI,(double)CONCAT44(value,in_stack_fffffffffffffc58));
  value_00 = (undefined1)(value >> 0x18);
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,
                     (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_248[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_238 = 0x576;
  local_230 = "checkIsLess(Json::Value(\"a\"), Json::Value(true))";
  local_228 = 0;
  local_220 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_248;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_248;
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,
                     (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  Json::Value::Value(in_RDI,(bool)value_00);
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_2c8[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b8 = 0x578;
  local_2b0 = "checkIsLess(Json::Value(true), Json::Value(Json::arrayValue))";
  local_2a8 = 0;
  local_2a0 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_2c8;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_2c8;
  Json::Value::Value(in_RDI,(bool)value_00);
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_348[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_338 = 0x57a;
  local_330 = "checkIsLess(Json::Value(Json::arrayValue), Json::Value(Json::objectValue))";
  local_328 = 0;
  local_320 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_348;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_348;
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  Json::Value::Value((Value *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  ValueTest::checkIsLess
            (in_stack_fffffffffffffc70,
             (Value *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),in_RDI);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  Json::Value::~Value(in_stack_fffffffffffffc90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareType) {
  // object of different type are ordered according to their type
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value(), Json::Value(1)));
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value(1), Json::Value(1u)));
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value(1u), Json::Value(1.0)));
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value(1.0), Json::Value("a")));
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value("a"), Json::Value(true)));
  JSONTEST_ASSERT_PRED(
      checkIsLess(Json::Value(true), Json::Value(Json::arrayValue)));
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value(Json::arrayValue),
                                   Json::Value(Json::objectValue)));
}